

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

void Abc_NodeMffcConeSuppPrint(Abc_Obj_t *pNode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *vCone_00;
  Vec_Ptr_t *vSupp_00;
  char *pcVar4;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vSupp;
  Vec_Ptr_t *vCone;
  Abc_Obj_t *pNode_local;
  
  vCone_00 = Vec_PtrAlloc(100);
  vSupp_00 = Vec_PtrAlloc(100);
  Abc_NodeDeref_rec(pNode);
  Abc_NodeMffcConeSupp(pNode,vCone_00,vSupp_00);
  Abc_NodeRef_rec(pNode);
  pcVar4 = Abc_ObjName(pNode);
  uVar1 = Vec_PtrSize(vSupp_00);
  uVar2 = Vec_PtrSize(vCone_00);
  printf("Node = %6s : Supp = %3d  Cone = %3d  (",pcVar4,(ulong)uVar1,(ulong)uVar2);
  for (local_2c = 0; iVar3 = Vec_PtrSize(vCone_00), local_2c < iVar3; local_2c = local_2c + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vCone_00,local_2c);
    pcVar4 = Abc_ObjName(pObj_00);
    printf(" %s",pcVar4);
  }
  printf(" )\n");
  Vec_PtrFree(vCone_00);
  Vec_PtrFree(vSupp_00);
  return;
}

Assistant:

void Abc_NodeMffcConeSuppPrint( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vCone, * vSupp;
    Abc_Obj_t * pObj;
    int i;
    vCone = Vec_PtrAlloc( 100 );
    vSupp = Vec_PtrAlloc( 100 );
    Abc_NodeDeref_rec( pNode );
    Abc_NodeMffcConeSupp( pNode, vCone, vSupp );
    Abc_NodeRef_rec( pNode );
    printf( "Node = %6s : Supp = %3d  Cone = %3d  (", 
        Abc_ObjName(pNode), Vec_PtrSize(vSupp), Vec_PtrSize(vCone) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, i )
        printf( " %s", Abc_ObjName(pObj) );
    printf( " )\n" );
    Vec_PtrFree( vCone );
    Vec_PtrFree( vSupp );
}